

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

Interval * __thiscall
tcu::FloatFormat::clampValue(Interval *__return_storage_ptr__,FloatFormat *this,double d)

{
  YesNoMaybe choice;
  double dVar1;
  double dVar2;
  int rExp;
  Interval local_60;
  double local_48;
  int local_34;
  Interval local_30;
  
  local_48 = d;
  dVar1 = deSign(d);
  local_34 = 0;
  deFractExp(local_48,&local_34);
  if (local_34 < this->m_minExp) {
    dVar1 = dVar1 * 0.0;
    local_60.m_hasNaN = NAN(dVar1);
    choice = this->m_hasSubnormal;
    local_60.m_lo = INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_lo = dVar1;
    }
    local_60.m_hi = -INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_hi = dVar1;
    }
    local_30.m_hasNaN = NAN(local_48);
    local_30.m_lo = INFINITY;
    local_30.m_hi = -INFINITY;
    if (!local_30.m_hasNaN) {
      local_30.m_lo = local_48;
      local_30.m_hi = local_48;
    }
  }
  else {
    if ((local_48 < -1.79769313486232e+308 == 1.79769313486232e+308 < local_48) &&
       (local_34 <= this->m_maxExp)) {
      __return_storage_ptr__->m_hasNaN = NAN(local_48);
      dVar1 = local_48;
      if (NAN(local_48)) {
        local_48 = INFINITY;
        dVar1 = -INFINITY;
      }
      __return_storage_ptr__->m_lo = local_48;
      __return_storage_ptr__->m_hi = dVar1;
      return __return_storage_ptr__;
    }
    dVar2 = this->m_maxValue * dVar1;
    local_60.m_hasNaN = NAN(dVar2);
    choice = this->m_hasInf;
    local_60.m_lo = INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_lo = dVar2;
    }
    local_60.m_hi = -INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_hi = dVar2;
    }
    dVar1 = dVar1 * INFINITY;
    local_30.m_hasNaN = NAN(dVar1);
    local_30.m_lo = INFINITY;
    local_30.m_hi = -INFINITY;
    if (!local_30.m_hasNaN) {
      local_30.m_lo = dVar1;
      local_30.m_hi = dVar1;
    }
  }
  anon_unknown_4::chooseInterval(__return_storage_ptr__,choice,&local_60,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::clampValue (double d) const
{
	const double	rSign		= deSign(d);
	int				rExp		= 0;

	DE_ASSERT(!deIsNaN(d));

	deFractExp(d, &rExp);
	if (rExp < m_minExp)
		return chooseInterval(m_hasSubnormal, rSign * 0.0, d);
	else if (deIsInf(d) || rExp > m_maxExp)
		return chooseInterval(m_hasInf, rSign * getMaxValue(), rSign * TCU_INFINITY);

	return Interval(d);
}